

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,char *ptr,Message *containing_type,InternalMetadataWithArena *metadata
          ,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *pDVar2;
  void *pvVar3;
  StringPiece flat;
  _Alloc_hider _Var4;
  int iVar5;
  int extraout_var;
  MessageLite *pMVar6;
  string *psVar7;
  char *pcVar8;
  undefined4 extraout_var_00;
  uint uVar9;
  long lVar10;
  uint32 res;
  uint uVar11;
  uint uVar12;
  UnknownFieldSet *this_00;
  byte *ptr_00;
  ushort *p;
  bool bVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_int> pVar15;
  pair<const_char_*,_bool> pVar16;
  bool was_packed_on_wire;
  string payload;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension;
  ulong local_100;
  bool local_f1;
  MessageFactory *local_f0;
  string local_e8;
  undefined **local_c8;
  EpsCopyInputStream local_c0;
  int local_68;
  undefined4 local_64;
  DescriptorPool *local_60;
  MessageFactory *pMStack_58;
  ExtensionInfo local_50;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_c8 = &PTR__ExtensionFinder_0066e9c0;
  local_100 = 0;
LAB_0030366c:
  do {
    do {
      while( true ) {
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
          if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
              (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00303a28;
          pVar16 = EpsCopyInputStream::DoneFallback
                             (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
          ptr = pVar16.first;
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_00303a28;
        }
        p = (ushort *)((byte *)ptr + 1);
        bVar1 = *ptr;
        pVar14.second._0_1_ = bVar1;
        pVar14.first = (char *)p;
        pVar14._9_7_ = 0;
        if (bVar1 != 0x1a) break;
        if ((int)local_100 == 0) {
          bVar1 = (byte)*p;
          uVar9 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            pVar15 = ReadSizeFallback((char *)p,(uint)bVar1);
            uVar9 = pVar15.second;
            ptr_00 = (byte *)pVar15.first;
            if (ptr_00 == (byte *)0x0) goto LAB_00303a1b;
          }
          else {
            ptr_00 = (byte *)ptr + 2;
          }
          ptr = EpsCopyInputStream::ReadString
                          (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar9,&local_e8);
        }
        else {
          ptr = ParseField(this,(local_100 & 0xffffffff) * 8 + 2,(char *)p,containing_type,metadata,
                           ctx);
        }
        local_100 = 0;
LAB_003036e3:
        if ((byte *)ptr == (byte *)0x0) goto LAB_00303a1b;
      }
      if (bVar1 != 0x10) {
        if ((char)bVar1 < '\0') {
          res = ((uint)bVar1 + (uint)(byte)*p * 0x80) - 0x80;
          if ((char)(byte)*p < '\0') {
            pVar14 = ReadTagFallback(ptr,res);
          }
          else {
            pVar14.second = res;
            pVar14.first = (char *)((byte *)ptr + 2);
            pVar14._12_4_ = 0;
          }
        }
        ptr = pVar14.first;
        uVar9 = pVar14.second;
        if ((uVar9 != 0) && ((uVar9 & 7) != 4)) {
          ptr = ParseField(this,pVar14._8_8_ & 0xffffffff,ptr,containing_type,metadata,ctx);
          goto LAB_003036e3;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
        goto LAB_00303a28;
      }
      uVar11 = (uint)(char)*p;
      uVar9 = *p + uVar11;
      uVar12 = uVar11 * 2 & uVar9;
      local_100 = (ulong)(uVar12 >> 1);
      if ((short)uVar12 < 0) {
        p = (ushort *)((byte *)ptr + 3);
        lVar10 = 0xd;
        while( true ) {
          uVar11 = (uint)(char)*p;
          uVar9 = *p + uVar11;
          uVar12 = uVar11 * 2 & uVar9;
          local_100 = ((ulong)uVar12 - 2 << ((byte)lVar10 & 0x3f)) + local_100;
          if (-1 < (short)uVar12) break;
          lVar10 = lVar10 + 0xe;
          p = p + 1;
          ptr = (char *)0x0;
          if (lVar10 == 0x45) goto LAB_00303a28;
        }
        bVar13 = uVar9 < uVar11;
      }
      else {
        bVar13 = uVar9 < uVar11;
      }
      ptr = (char *)((long)p + (ulong)bVar13 + 1);
    } while ((MessageFactory *)local_e8._M_string_length == (MessageFactory *)0x0);
    pDVar2 = (ctx->data_).pool;
    iVar5 = (int)local_100;
    if (pDVar2 == (DescriptorPool *)0x0) {
      local_c0.limit_end_ = (char *)local_c8;
      local_c0.buffer_end_ = (char *)containing_type;
      bVar13 = FindExtensionInfoFromFieldNumber
                         (this,2,iVar5,(ExtensionFinder *)&local_c0,&local_50,&local_f1);
    }
    else {
      local_f0 = (ctx->data_).factory;
      local_c0.size_ =
           (*(containing_type->super_MessageLite)._vptr_MessageLite[0x15])(containing_type);
      local_c0.limit_ = extraout_var;
      local_c0.limit_end_ = (char *)&PTR__ExtensionFinder_00670c10;
      local_c0.next_chunk_ = (char *)local_f0;
      local_c0.buffer_end_ = (char *)pDVar2;
      bVar13 = FindExtensionInfoFromFieldNumber
                         (this,2,iVar5,(ExtensionFinder *)&local_c0,&local_50,&local_f1);
    }
    ExtensionFinder::~ExtensionFinder((ExtensionFinder *)&local_c0);
    _Var4._M_p = local_e8._M_dataplus._M_p;
    if (bVar13 == false) {
      local_f0 = (MessageFactory *)local_e8._M_string_length;
      pvVar3 = (metadata->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&metadata->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        this_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      psVar7 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_00,iVar5);
      std::__cxx11::string::_M_replace
                ((ulong)psVar7,0,(char *)psVar7->_M_string_length,(ulong)_Var4._M_p);
      local_100 = 0;
      goto LAB_0030366c;
    }
    if (local_50.is_repeated == true) {
      pMVar6 = AddMessage(this,iVar5,'\v',(MessageLite *)local_50.field_3.enum_validity_check.func,
                          local_50.descriptor);
    }
    else {
      pMVar6 = MutableMessage(this,iVar5,'\v',
                              (MessageLite *)local_50.field_3.enum_validity_check.func,
                              local_50.descriptor);
    }
    local_68 = ctx->depth_;
    local_c0.buffer_[0x18] = '\0';
    local_c0.buffer_[0x19] = '\0';
    local_c0.buffer_[0x1a] = '\0';
    local_c0.buffer_[0x1b] = '\0';
    local_c0.buffer_[0x1c] = '\0';
    local_c0.buffer_[0x1d] = '\0';
    local_c0.buffer_[0x1e] = '\0';
    local_c0.buffer_[0x1f] = '\0';
    local_c0.aliasing_ = 0;
    local_c0.buffer_[8] = '\0';
    local_c0.buffer_[9] = '\0';
    local_c0.buffer_[10] = '\0';
    local_c0.buffer_[0xb] = '\0';
    local_c0.buffer_[0xc] = '\0';
    local_c0.buffer_[0xd] = '\0';
    local_c0.buffer_[0xe] = '\0';
    local_c0.buffer_[0xf] = '\0';
    local_c0.buffer_[0x10] = '\0';
    local_c0.buffer_[0x11] = '\0';
    local_c0.buffer_[0x12] = '\0';
    local_c0.buffer_[0x13] = '\0';
    local_c0.buffer_[0x14] = '\0';
    local_c0.buffer_[0x15] = '\0';
    local_c0.buffer_[0x16] = '\0';
    local_c0.buffer_[0x17] = '\0';
    local_c0.zcis_ = (ZeroCopyInputStream *)0x0;
    local_c0.buffer_[0] = '\0';
    local_c0.buffer_[1] = '\0';
    local_c0.buffer_[2] = '\0';
    local_c0.buffer_[3] = '\0';
    local_c0.buffer_[4] = '\0';
    local_c0.buffer_[5] = '\0';
    local_c0.buffer_[6] = '\0';
    local_c0.buffer_[7] = '\0';
    local_c0.last_tag_minus_1_ = 0;
    local_c0.overall_limit_ = 0x7fffffff;
    local_64 = 0x80000000;
    local_60 = (DescriptorPool *)0x0;
    pMStack_58 = (MessageFactory *)0x0;
    flat.length_ = local_e8._M_string_length;
    flat.ptr_ = local_e8._M_dataplus._M_p;
    pcVar8 = EpsCopyInputStream::InitFrom(&local_c0,flat);
    local_60 = (ctx->data_).pool;
    pMStack_58 = (ctx->data_).factory;
    iVar5 = (*pMVar6->_vptr_MessageLite[0xd])(pMVar6,pcVar8,&local_c0);
    if (CONCAT44(extraout_var_00,iVar5) == 0) {
      ptr = (char *)0x0;
      goto LAB_00303a28;
    }
    local_100 = 0;
    if (local_c0.last_tag_minus_1_ != 0) {
LAB_00303a1b:
      ptr = (char *)0x0;
LAB_00303a28:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}